

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CampaignData.cpp
# Opt level: O0

int adios2::core::engine::sqlcb_host(void *p,int argc,char **argv,char **azColName)

{
  char *pcVar1;
  undefined8 *in_RDX;
  CampaignHost ch;
  CampaignData *cdp;
  CampaignHost *in_stack_fffffffffffffef0;
  CampaignHost *this;
  value_type *__x;
  vector<adios2::core::engine::CampaignHost,_std::allocator<adios2::core::engine::CampaignHost>_>
  *this_00;
  allocator local_d9;
  undefined1 local_d8 [56];
  undefined1 local_a0 [136];
  undefined8 *local_18;
  
  local_18 = in_RDX;
  CampaignHost::CampaignHost(in_stack_fffffffffffffef0);
  pcVar1 = (char *)*local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_a0,pcVar1,(allocator *)(local_d8 + 0x37));
  __x = (value_type *)local_a0;
  std::__cxx11::string::operator=((string *)(local_a0 + 0x20),(string *)__x);
  std::__cxx11::string::~string((string *)__x);
  std::allocator<char>::~allocator((allocator<char> *)(local_d8 + 0x37));
  this_00 = (vector<adios2::core::engine::CampaignHost,_std::allocator<adios2::core::engine::CampaignHost>_>
             *)local_18[1];
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_d8,(char *)this_00,&local_d9);
  this = (CampaignHost *)local_d8;
  std::__cxx11::string::operator=((string *)(local_a0 + 0x40),(string *)this);
  std::__cxx11::string::~string((string *)this);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  std::
  vector<adios2::core::engine::CampaignHost,_std::allocator<adios2::core::engine::CampaignHost>_>::
  push_back(this_00,__x);
  CampaignHost::~CampaignHost(this);
  return 0;
}

Assistant:

static int sqlcb_host(void *p, int argc, char **argv, char **azColName)
{
    CampaignData *cdp = reinterpret_cast<CampaignData *>(p);
    CampaignHost ch;
    /*
    std::cout << "SQL: host record: ";
    for (int i = 0; i < argc; i++)
    {
        std::cout << azColName[i] << " = " << (argv[i] ? argv[i] : "NULL")
                  << std::endl;
    }
    std::cout << std::endl;
    */
    ch.hostname = std::string(argv[0]);
    ch.longhostname = std::string(argv[1]);
    cdp->hosts.push_back(ch);
    return 0;
}